

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

void INT_EVadd_standard_routines(CManager cm,char *extern_string,cod_extern_entry *externs)

{
  long *plVar1;
  _event_path_data *p_Var2;
  extern_routines p_Var3;
  ulong uVar4;
  ulong uVar5;
  
  p_Var2 = cm->evp;
  p_Var3 = p_Var2->externs;
  if (p_Var3 == (extern_routines)0x0) {
    p_Var3 = (extern_routines)INT_CMmalloc(0x20);
    uVar4 = 0;
  }
  else {
    uVar5 = 0x10;
    uVar4 = 0xffffffffffffffff;
    do {
      uVar4 = (ulong)((int)uVar4 + 1);
      plVar1 = (long *)((long)&p_Var3[-1].extern_decl + uVar5);
      uVar5 = uVar5 + 0x10;
    } while (*plVar1 != 0);
    p_Var3 = (extern_routines)INT_CMrealloc(p_Var3,uVar5 & 0xffffffff0);
  }
  p_Var2->externs = p_Var3;
  p_Var3[uVar4].extern_decl = extern_string;
  p_Var3[uVar4].externs = externs;
  p_Var3[uVar4 + 1].extern_decl = (char *)0x0;
  p_Var3[uVar4 + 1].externs = (cod_extern_entry *)0x0;
  return;
}

Assistant:

extern void 
INT_EVadd_standard_routines(CManager cm, char *extern_string,
			    cod_extern_entry *externs)
{
    event_path_data evp = cm->evp;
    int count = 0;
    if (evp->externs == NULL) {
	evp->externs = malloc(sizeof(evp->externs[0]) * 2);
    } else {
	while(evp->externs[count].extern_decl != NULL) count++;
	evp->externs = realloc(evp->externs, 
			       sizeof(evp->externs[0]) * (count + 2));
    }
    evp->externs[count].extern_decl = extern_string;
    evp->externs[count].externs = externs;
    evp->externs[count + 1].extern_decl = NULL;
    evp->externs[count + 1].externs = NULL;
}